

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

string * str_xor(string *__return_storage_ptr__,string *s,char *t)

{
  size_type sVar1;
  byte *pbVar2;
  byte *pbVar3;
  size_t i;
  ulong uVar4;
  
  sVar1 = s->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar1);
  pbVar3 = (byte *)t;
  for (uVar4 = 0; uVar4 < s->_M_string_length; uVar4 = uVar4 + 1) {
    pbVar2 = (byte *)t;
    if (*pbVar3 != 0) {
      pbVar2 = pbVar3;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar4] = *pbVar2 ^ (s->_M_dataplus)._M_p[uVar4];
    pbVar3 = pbVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str_xor (const std::string& s, const char* t)
{
    const char* pc = t;
    std::string r ( s.size(), '\0');
    for (size_t i = 0; i < s.size(); ++i, ++pc) {
        if (!(*pc)) pc = t;                     // restart at end of string
        r[i] = s[i] ^ *pc;
    }
    return r;
}